

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void prf_messages_add_handler
               (int type,int level,_func_void_int_int_char_ptr_void_ptr *func,void *data)

{
  ulong uVar1;
  uint uVar2;
  prf_msg_handler_t *elem;
  ulong uVar3;
  prf_msg_handler_t **pppVar4;
  ulong uVar5;
  
  elem = (prf_msg_handler_t *)malloc(0x18);
  elem->level = level;
  elem->func = func;
  elem->userdata = data;
  uVar2 = prf_array_count(prf_handlers[type]);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
  }
  pppVar4 = prf_handlers[type];
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (uVar3 == uVar5) {
      pppVar4 = (prf_msg_handler_t **)prf_array_append_ptr(pppVar4,elem);
      prf_handlers[type] = pppVar4;
      return;
    }
    uVar1 = uVar5 + 1;
  } while (pppVar4[uVar5] != (prf_msg_handler_t *)0x0);
  pppVar4[uVar5] = elem;
  return;
}

Assistant:

void
prf_messages_add_handler(
    int type,
    int level,
    void (*func)( int, int, const char *, void * ),
    void * data )
{
    prf_msg_handler_t * handler;
    int i = 0, count;
    assert( type > 0 && type < 6 );
    handler = (prf_msg_handler_t *)malloc( sizeof( prf_msg_handler_t ) );
    assert( handler != NULL );
    handler->level = level;
    handler->func = func;
    handler->userdata = data;
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] == NULL ) {
            prf_handlers[type][i] = handler;
            return;
        }
    }
    prf_handlers[type] = 
      (prf_msg_handler_t **)prf_array_append_ptr( prf_handlers[type], handler);
}